

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj_encoder.cc
# Opt level: O3

bool __thiscall draco::ObjEncoder::EncodeFaceAttributes(ObjEncoder *this,FaceIndex face_id)

{
  bool bVar1;
  
  if (this->sub_obj_att_ == (PointAttribute *)0x0) {
LAB_00110ce0:
    if (this->material_att_ != (PointAttribute *)0x0) {
      bVar1 = EncodeMaterial(this,face_id);
      if (!bVar1) goto LAB_00110cf9;
    }
    bVar1 = true;
  }
  else {
    bVar1 = EncodeSubObject(this,face_id);
    if (bVar1) goto LAB_00110ce0;
LAB_00110cf9:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ObjEncoder::EncodeFaceAttributes(FaceIndex face_id) {
  if (sub_obj_att_) {
    if (!EncodeSubObject(face_id)) {
      return false;
    }
  }
  if (material_att_) {
    if (!EncodeMaterial(face_id)) {
      return false;
    }
  }
  return true;
}